

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModVerify.cpp
# Opt level: O2

void __thiscall mod_verify::ModVerifyTest1<short>::ModVerifyTest1(ModVerifyTest1<short> *this)

{
  ostream *poVar1;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> m;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> x;
  short r;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_54;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_52;
  string local_50;
  string local_30;
  
  local_52.m_int = -0x8000;
  local_50._M_dataplus._M_p._0_4_ = 0;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<int>(&local_54,(int *)&local_50);
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator%
            (&local_52,local_54);
  poVar1 = std::operator<<((ostream *)&std::cerr,"Error in case ");
  type_name<short>();
  poVar1 = std::operator<<(poVar1,(string *)&local_50);
  std::operator<<(poVar1,": ");
  std::__cxx11::string::~string((string *)&local_50);
  to_hex<short>(&local_50,local_52.m_int);
  poVar1 = std::operator<<((ostream *)&std::cerr,(string *)&local_50);
  poVar1 = std::operator<<(poVar1,", ");
  to_hex<short>(&local_30,local_54.m_int);
  poVar1 = std::operator<<(poVar1,(string *)&local_30);
  std::operator<<(poVar1,", ");
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  poVar1 = std::operator<<((ostream *)&std::cerr,"expected = ");
  poVar1 = std::operator<<(poVar1,"divzero");
  std::endl<char,std::char_traits<char>>(poVar1);
  local_50._M_dataplus._M_p._0_4_ = CONCAT22(local_50._M_dataplus._M_p._2_2_,local_52.m_int);
  operator%=((short *)&local_50,local_54);
  poVar1 = std::operator<<((ostream *)&std::cerr,"Error in case ");
  type_name<short>();
  poVar1 = std::operator<<(poVar1,(string *)&local_50);
  std::operator<<(poVar1,": ");
  std::__cxx11::string::~string((string *)&local_50);
  to_hex<short>(&local_50,local_52.m_int);
  poVar1 = std::operator<<((ostream *)&std::cerr,(string *)&local_50);
  poVar1 = std::operator<<(poVar1,", ");
  to_hex<short>(&local_30,local_54.m_int);
  poVar1 = std::operator<<(poVar1,(string *)&local_30);
  std::operator<<(poVar1,", ");
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  poVar1 = std::operator<<((ostream *)&std::cerr,"expected = ");
  poVar1 = std::operator<<(poVar1,"divzero");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

ModVerifyTest1<T>()
	{
		const size_t width = sizeof(T);
		const size_t shift = width * CHAR_BIT - 1;
		const bool expected = true;

		bool divzero;
		SafeInt<T> x = (T)((std::uint64_t)1 << shift);
		SafeInt<T> m(0);

		///////////////////////////////////////////////

		try
		{
			T r;
			r = x % m;
			divzero = false;
		}
		catch(SafeIntException&)
		{
			divzero = true;
		}

		if(divzero != expected)
		{
			std::cerr << "Error in case " << type_name<T>() << ": ";
			std::cerr << to_hex((T)x) << ", " << to_hex((T)m) << ", ";
			std::cerr << "expected = " << (expected ? "divzero" : "no divzero") << std::endl;
		}

		///////////////////////////////////////////////

		try
		{
			T r = x;
			r %= m;
			divzero = false;
		}
		catch(SafeIntException&)
		{
			divzero = true;
		}

		if(divzero != expected)
		{
			std::cerr << "Error in case " << type_name<T>() << ": ";
			std::cerr << to_hex((T)x) << ", " << to_hex((T)m) << ", ";
			std::cerr << "expected = " << (expected ? "divzero" : "no divzero") << std::endl;
		}
	}